

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert_manager.cpp
# Opt level: O0

int __thiscall
libtorrent::alert_manager::set_alert_queue_size_limit(alert_manager *this,int queue_size_limit_)

{
  int iVar1;
  lock_guard<std::recursive_mutex> local_20;
  lock_guard<std::recursive_mutex> lock;
  int queue_size_limit__local;
  alert_manager *this_local;
  
  lock._M_device._4_4_ = queue_size_limit_;
  std::lock_guard<std::recursive_mutex>::lock_guard(&local_20,&this->m_mutex);
  std::swap<int>(&this->m_queue_size_limit,(int *)((long)&lock._M_device + 4));
  iVar1 = lock._M_device._4_4_;
  std::lock_guard<std::recursive_mutex>::~lock_guard(&local_20);
  return iVar1;
}

Assistant:

int alert_manager::set_alert_queue_size_limit(int queue_size_limit_)
	{
		std::lock_guard<std::recursive_mutex> lock(m_mutex);

		std::swap(m_queue_size_limit, queue_size_limit_);
		return queue_size_limit_;
	}